

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O2

int Gia_ManRebuildNode(Dsd_Manager_t *pManDsd,Dsd_Node_t *pNodeDsd,Gia_Man_t *pNew,DdManager *ddNew,
                      Vec_Int_t *vFanins,Vec_Str_t *vSop,Vec_Str_t *vCube)

{
  Dsd_Type_t iLit0;
  int iVar1;
  int iVar2;
  DdManager *dd;
  Dsd_Node_t *pDVar3;
  DdNode *n;
  DdNode *n_00;
  int iVar4;
  
  dd = Dsd_ManagerReadDd(pManDsd);
  iLit0 = Dsd_NodeReadType(pNodeDsd);
  iVar1 = Dsd_NodeReadDecsNum(pNodeDsd);
  if (iVar1 < 2) {
    __assert_fail("nDecs > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                  ,0x9f,
                  "int Gia_ManRebuildNode(Dsd_Manager_t *, Dsd_Node_t *, Gia_Man_t *, DdManager *, Vec_Int_t *, Vec_Str_t *, Vec_Str_t *)"
                 );
  }
  vFanins->nSize = 0;
  iVar4 = 0;
  do {
    if (iVar1 == iVar4) {
      switch(iLit0) {
      case DSD_NODE_CONST1:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                      ,0xcc,
                      "int Gia_ManRebuildNode(Dsd_Manager_t *, Dsd_Node_t *, Gia_Man_t *, DdManager *, Vec_Int_t *, Vec_Str_t *, Vec_Str_t *)"
                     );
      case DSD_NODE_OR:
        iLit0 = DSD_NODE_NONE;
        for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
          iVar2 = Vec_IntEntry(vFanins,iVar4);
          iLit0 = Gia_ManHashOr(pNew,iLit0,iVar2);
        }
        break;
      case DSD_NODE_EXOR:
        iLit0 = DSD_NODE_NONE;
        for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
          iVar2 = Vec_IntEntry(vFanins,iVar4);
          iLit0 = Gia_ManHashXor(pNew,iLit0,iVar2);
        }
        break;
      case DSD_NODE_PRIME:
        n = Dsd_TreeGetPrimeFunction(dd,pNodeDsd);
        Cudd_Ref(n);
        n_00 = Extra_TransferLevelByLevel(dd,ddNew,n);
        Cudd_Ref(n_00);
        Cudd_RecursiveDeref(dd,n);
        iLit0 = Gia_ManRebuildIsop(ddNew,n_00,pNew,vFanins,vSop,vCube);
        Cudd_RecursiveDeref(ddNew,n_00);
      }
      Dsd_NodeSetMark(pNodeDsd,iLit0);
      return iLit0;
    }
    pDVar3 = Dsd_NodeReadDec(pNodeDsd,iVar4);
    iVar2 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe));
    iVar2 = Abc_LitNotCond(iVar2,(uint)pDVar3 & 1);
    if ((iLit0 != DSD_NODE_OR) && (((ulong)pDVar3 & 1) != 0)) {
      __assert_fail("Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                    ,0xa6,
                    "int Gia_ManRebuildNode(Dsd_Manager_t *, Dsd_Node_t *, Gia_Man_t *, DdManager *, Vec_Int_t *, Vec_Str_t *, Vec_Str_t *)"
                   );
    }
    Vec_IntPush(vFanins,iVar2);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int Gia_ManRebuildNode( Dsd_Manager_t * pManDsd, Dsd_Node_t * pNodeDsd, Gia_Man_t * pNew, DdManager * ddNew, Vec_Int_t * vFanins, Vec_Str_t * vSop, Vec_Str_t * vCube )
{
    DdManager * ddDsd = Dsd_ManagerReadDd( pManDsd );
    DdNode * bLocal, * bTemp;
    Dsd_Node_t * pFaninDsd;
    Dsd_Type_t Type;
    int i, nDecs, iLit = -1;

    // add the fanins
    Type  = Dsd_NodeReadType( pNodeDsd );
    nDecs = Dsd_NodeReadDecsNum( pNodeDsd );
    assert( nDecs > 1 );
    Vec_IntClear( vFanins );
    for ( i = 0; i < nDecs; i++ )
    {
        pFaninDsd = Dsd_NodeReadDec( pNodeDsd, i );
        iLit      = Dsd_NodeReadMark( Dsd_Regular(pFaninDsd) );
        iLit      = Abc_LitNotCond( iLit, Dsd_IsComplement(pFaninDsd) );
        assert( Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd) );
        Vec_IntPush( vFanins, iLit );
    }

    // create the local function depending on the type of the node
    switch ( Type )
    {
        case DSD_NODE_CONST1:
        {
            iLit = 1;
            break;
        }
        case DSD_NODE_OR:
        {
            iLit = 0;
            for ( i = 0; i < nDecs; i++ )
                iLit = Gia_ManHashOr( pNew, iLit, Vec_IntEntry(vFanins, i) );
            break;
        }
        case DSD_NODE_EXOR:
        {
            iLit = 0;
            for ( i = 0; i < nDecs; i++ )
                iLit = Gia_ManHashXor( pNew, iLit, Vec_IntEntry(vFanins, i) );
            break;
        }
        case DSD_NODE_PRIME:
        {
            bLocal = Dsd_TreeGetPrimeFunction( ddDsd, pNodeDsd );                Cudd_Ref( bLocal );
            bLocal = Extra_TransferLevelByLevel( ddDsd, ddNew, bTemp = bLocal ); Cudd_Ref( bLocal );
            Cudd_RecursiveDeref( ddDsd, bTemp );
            // bLocal is now in the new BDD manager
            iLit = Gia_ManRebuildIsop( ddNew, bLocal, pNew, vFanins, vSop, vCube );
            Cudd_RecursiveDeref( ddNew, bLocal );
            break;
        }
        default:
        {
            assert( 0 );
            break;
        }
    }
    Dsd_NodeSetMark( pNodeDsd, iLit );
    return iLit;
}